

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalBenchmarks.hpp
# Opt level: O2

void benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Ui>::HandlerSize
               (BenchmarkContext *context)

{
  __sighandler_t __handler;
  int __sig;
  string *name;
  SignalType s;
  StorageArray<wigwag::token> c;
  HandlerType handler;
  allocator local_79;
  SignalType local_78;
  string local_70;
  anon_class_8_1_54a39803 local_50;
  StorageArray<wigwag::token> local_48;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/koplyarov[P]wigwag/src/benchmarks/descriptors/signal/wigwag.hpp:36:45)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/koplyarov[P]wigwag/src/benchmarks/descriptors/signal/wigwag.hpp:36:45)>
             ::_M_manager;
  local_78._impl._s._ptr._raw =
       (creation_storage_adapter<wigwag::creation::lazy::storage<wigwag::detail::intrusive_ptr<wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>_>,_wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>_>_>
        )(storage<wigwag::detail::intrusive_ptr<wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>_>,_wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>_>
          )0x0;
  StorageArray<wigwag::token>::StorageArray(&local_48,context->_iterationsCount);
  local_70._M_dataplus._M_p = (pointer)&local_78;
  local_70._M_string_length = (size_type)&local_38;
  StorageArray<wigwag::token>::
  Construct<benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Ui>::HandlerSize(benchmarks::BenchmarkContext&)::_lambda()_1_>
            (&local_48,(anon_class_16_2_8e986c60 *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"handler",(allocator *)&local_50);
  (*context->_vptr_BenchmarkContext[2])(context,&local_70,context->_iterationsCount);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"disconnect",&local_79);
  name = &local_70;
  local_50.c = &local_48;
  BenchmarkContext::
  Profile<benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Ui>::HandlerSize(benchmarks::BenchmarkContext&)::_lambda()_2_>
            (context,name,context->_iterationsCount,&local_50);
  __sig = (int)name;
  std::__cxx11::string::~string((string *)&local_70);
  StorageArray<wigwag::token>::~StorageArray(&local_48);
  wigwag::
  signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>
  ::~signal(&local_78,__sig,__handler);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return;
}

Assistant:

static void HandlerSize(BenchmarkContext& context)
        {
            HandlerType handler = SignalsDesc_::MakeHandler();
            SignalType s;
            StorageArray<ConnectionType> c(context.GetIterationsCount());

            c.Construct([&]{ return s.connect(handler); });
            context.MeasureMemory("handler", context.GetIterationsCount());
            context.Profile("disconnect", context.GetIterationsCount(), [&]{ c.Destruct(); });
        }